

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::detail::FormatArg::formatImpl<char[12]>
               (ostream *out,char *fmtBegin,char *fmtEnd,int ntrunc,void *value)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  char *in_RSI;
  char *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  
  formatValue<char[12]>
            ((ostream *)value,in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20),
             (char (*) [12])CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

TINYFORMAT_HIDDEN static void formatImpl(std::ostream& out, const char* fmtBegin,
                        const char* fmtEnd, int ntrunc, const void* value)
        {
            formatValue(out, fmtBegin, fmtEnd, ntrunc, *static_cast<const T*>(value));
        }